

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmGhsMultiTargetGenerator::SetCompilerFlags
          (cmGhsMultiTargetGenerator *this,string *config,string *language)

{
  cmGeneratorTarget *pcVar1;
  cmLocalGenerator *pcVar2;
  cmLocalGhsMultiGenerator *pcVar3;
  bool bVar4;
  char *pcVar5;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_basic_string<char>_>_&>::value,_pair<iterator,_bool>_>
  _Var6;
  undefined1 local_188 [8];
  value_type entry;
  string local_140;
  string local_120;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  char *local_58;
  char *lang;
  string flags;
  _Self local_28;
  iterator i;
  string *language_local;
  string *config_local;
  cmGhsMultiTargetGenerator *this_local;
  
  i._M_node = (_Base_ptr)language;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->FlagsByLanguage,language);
  flags.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->FlagsByLanguage);
  bVar4 = std::operator==(&local_28,(_Self *)((long)&flags.field_2 + 8));
  if (bVar4) {
    std::__cxx11::string::string((string *)&lang);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pcVar1 = this->GeneratorTarget;
    pcVar2 = &this->LocalGenerator->super_cmLocalGenerator;
    local_58 = pcVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar5,&local_79);
    cmLocalGenerator::AddLanguageFlags(pcVar2,(string *)&lang,pcVar1,&local_78,config);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    pcVar5 = local_58;
    pcVar1 = this->GeneratorTarget;
    pcVar2 = &this->LocalGenerator->super_cmLocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar5,&local_b1);
    cmLocalGenerator::AddCMP0018Flags(pcVar2,(string *)&lang,pcVar1,&local_b0,config);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    pcVar5 = local_58;
    pcVar1 = this->GeneratorTarget;
    pcVar2 = &this->LocalGenerator->super_cmLocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar5,&local_d9);
    cmLocalGenerator::AddVisibilityPresetFlags(pcVar2,(string *)&lang,pcVar1,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    cmMakefile::GetDefineFlags_abi_cxx11_(&local_100,this->Makefile);
    bVar4 = std::operator!=(&local_100," ");
    std::__cxx11::string::~string((string *)&local_100);
    if (bVar4) {
      pcVar3 = this->LocalGenerator;
      cmMakefile::GetDefineFlags_abi_cxx11_(&local_120,this->Makefile);
      (*(pcVar3->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar3,&lang,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
    }
    pcVar5 = local_58;
    pcVar1 = this->GeneratorTarget;
    pcVar2 = &this->LocalGenerator->super_cmLocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,pcVar5,
               (allocator<char> *)(entry.second.field_2._M_local_buf + 0xf));
    cmLocalGenerator::AddCompileOptions(pcVar2,(string *)&lang,pcVar1,&local_140,config);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)(entry.second.field_2._M_local_buf + 0xf));
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_188,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)i._M_node,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lang);
    _Var6 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string_const,std::__cxx11::string>&>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&this->FlagsByLanguage,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_188);
    local_28._M_node = (_Base_ptr)_Var6.first._M_node;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_188);
    std::__cxx11::string::~string((string *)&lang);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::SetCompilerFlags(std::string const& config,
                                                 const std::string& language)
{
  std::map<std::string, std::string>::iterator i =
    this->FlagsByLanguage.find(language);
  if (i == this->FlagsByLanguage.end()) {
    std::string flags;
    const char* lang = language.c_str();

    this->LocalGenerator->AddLanguageFlags(flags, this->GeneratorTarget, lang,
                                           config);

    this->LocalGenerator->AddCMP0018Flags(flags, this->GeneratorTarget, lang,
                                          config);
    this->LocalGenerator->AddVisibilityPresetFlags(
      flags, this->GeneratorTarget, lang);

    // Append old-style preprocessor definition flags.
    if (this->Makefile->GetDefineFlags() != " ") {
      this->LocalGenerator->AppendFlags(flags,
                                        this->Makefile->GetDefineFlags());
    }

    // Add target-specific flags.
    this->LocalGenerator->AddCompileOptions(flags, this->GeneratorTarget, lang,
                                            config);

    std::map<std::string, std::string>::value_type entry(language, flags);
    i = this->FlagsByLanguage.insert(entry).first;
  }
}